

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mlkem_test.cc
# Opt level: O1

void __thiscall
anon_unknown.dwarf_8399fe::MLKEMTest_Iterate1024_Test::TestBody(MLKEMTest_Iterate1024_Test *this)

{
  int iVar1;
  BCM_mlkem1024_private_key *out_private_key;
  MLKEM1024_public_key *out_public_key;
  MLKEM1024_private_key *t;
  char *message;
  char *in_R9;
  int iVar2;
  AssertionResult gtest_ar_;
  vector<unsigned_char,_std::allocator<unsigned_char>_> encoded_priv;
  uint8_t result [32];
  uint8_t shared_secret [32];
  uint8_t encap_entropy [32];
  BORINGSSL_keccak_st generate_st;
  uint8_t seed [64];
  BORINGSSL_keccak_st results_st;
  uint8_t invalid_ciphertext [1568];
  uint8_t ciphertext [1568];
  uint8_t kExpected [32];
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_1570;
  AssertHelper local_1568;
  internal local_1560 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_1558;
  vector<unsigned_char,_std::allocator<unsigned_char>_> local_1550;
  string local_1538;
  long local_1518 [4];
  uint8_t local_14f8 [32];
  uint8_t local_14d8 [40];
  AssertHelperData *local_14b0;
  uint64_t local_14a8;
  uint8_t local_13c8 [72];
  BORINGSSL_keccak_st local_1380;
  Bytes local_1298 [98];
  internal local_c78 [8];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *local_c70 [195];
  AssertHelperData local_658 [28];
  
  BORINGSSL_keccak_init((BORINGSSL_keccak_st *)&local_14b0,boringssl_shake128);
  BORINGSSL_keccak_init(&local_1380,boringssl_shake128);
  out_private_key = (BCM_mlkem1024_private_key *)operator_new(0x3060);
  memset(out_private_key,0,0x3060);
  out_public_key = (MLKEM1024_public_key *)operator_new(0x2840);
  memset(out_public_key,0,0x2840);
  iVar2 = 10000;
  do {
    BORINGSSL_keccak_squeeze((BORINGSSL_keccak_st *)&local_14b0,local_13c8,0x40);
    BCM_mlkem1024_generate_key_external_seed((uint8_t *)local_658,out_private_key,local_13c8);
    MLKEM1024_public_from_private(out_public_key,(MLKEM1024_private_key *)out_private_key);
    BORINGSSL_keccak_absorb(&local_1380,(uint8_t *)local_658,0x620);
    Marshal<MLKEM1024_private_key>
              (&local_1550,(_func_int_CBB_ptr_MLKEM1024_private_key_ptr *)out_private_key,t);
    BORINGSSL_keccak_absorb
              (&local_1380,
               local_1550.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
               super__Vector_impl_data._M_start,
               (long)local_1550.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_finish -
               (long)local_1550.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                     _M_impl.super__Vector_impl_data._M_start);
    BORINGSSL_keccak_squeeze((BORINGSSL_keccak_st *)&local_14b0,local_14d8,0x20);
    BCM_mlkem1024_encap_external_entropy
              ((uint8_t *)local_c78,local_14f8,(BCM_mlkem1024_public_key *)out_public_key,local_14d8
              );
    BORINGSSL_keccak_absorb(&local_1380,(uint8_t *)local_c78,0x620);
    BORINGSSL_keccak_absorb(&local_1380,local_14f8,0x20);
    BORINGSSL_keccak_squeeze((BORINGSSL_keccak_st *)&local_14b0,(uint8_t *)local_1298,0x620);
    iVar1 = MLKEM1024_decap(local_14f8,(uint8_t *)local_1298,0x620,
                            (MLKEM1024_private_key *)out_private_key);
    local_1560[0] = (internal)(iVar1 != 0);
    local_1558 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
    if (iVar1 == 0) {
      testing::Message::Message((Message *)&local_1570);
      testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
                (&local_1538,local_1560,
                 (AssertionResult *)
                 "DECAP(shared_secret, invalid_ciphertext, sizeof(invalid_ciphertext), priv.get())",
                 "false","true",in_R9);
      testing::internal::AssertHelper::AssertHelper
                (&local_1568,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mlkem/mlkem_test.cc"
                 ,0x1e2,local_1538._M_dataplus._M_p);
      testing::internal::AssertHelper::operator=(&local_1568,(Message *)&local_1570);
      testing::internal::AssertHelper::~AssertHelper(&local_1568);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_1538._M_dataplus._M_p != &local_1538.field_2) {
        operator_delete(local_1538._M_dataplus._M_p,local_1538.field_2._M_allocated_capacity + 1);
      }
      if (local_1570._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_1570._M_head_impl + 8))();
      }
      if (local_1558 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::
        default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
        ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                      *)&local_1558,local_1558);
      }
      if (local_1550.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start != (uint8_t *)0x0) {
        operator_delete(local_1550.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                        ._M_impl.super__Vector_impl_data._M_start,
                        (long)local_1550.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage -
                        (long)local_1550.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_start);
      }
      goto LAB_00346fc4;
    }
    BORINGSSL_keccak_absorb(&local_1380,local_14f8,0x20);
    if (local_1550.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
        super__Vector_impl_data._M_start != (uint8_t *)0x0) {
      operator_delete(local_1550.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                      _M_impl.super__Vector_impl_data._M_start,
                      (long)local_1550.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_end_of_storage -
                      (long)local_1550.
                            super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                            _M_impl.super__Vector_impl_data._M_start);
    }
    iVar2 = iVar2 + -1;
  } while (iVar2 != 0);
  BORINGSSL_keccak_squeeze(&local_1380,(uint8_t *)local_1518,0x20);
LAB_00346fc4:
  operator_delete(out_public_key,0x2840);
  operator_delete(out_private_key,0x3060);
  local_658[0].line = -0x196b197e;
  local_658[0]._20_4_ = 0xab042438;
  local_658[0].message._M_dataplus._M_p = (pointer)0xd5ba758b908b94db;
  local_658[0].type = 0xb082bfe3;
  local_658[0]._4_4_ = 0x2e7b3013;
  local_658[0].file = (char *)0xfc6dff91e7dd479d;
  local_1298[0].span_.data_ = (uchar *)local_1518;
  local_1298[0].span_.size_ = 0x20;
  local_14b0 = local_658;
  local_14a8 = 0x20;
  testing::internal::CmpHelperEQ<Bytes,Bytes>
            (local_c78,"Bytes(result)","Bytes(kExpected)",local_1298,(Bytes *)&local_14b0);
  if (local_c78[0] == (internal)0x0) {
    testing::Message::Message((Message *)local_1298);
    if (local_c70[0] == (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
      message = "";
    }
    else {
      message = (local_c70[0]->_M_dataplus)._M_p;
    }
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&local_14b0,kNonFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/mlkem/mlkem_test.cc"
               ,0x210,message);
    testing::internal::AssertHelper::operator=((AssertHelper *)&local_14b0,(Message *)local_1298);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_14b0);
    if ((long *)local_1298[0].span_.data_ != (long *)0x0) {
      (**(code **)(*(long *)local_1298[0].span_.data_ + 8))();
    }
  }
  if (local_c70[0] != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
    std::
    default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
    ::operator()((default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_c70,local_c70[0]);
  }
  return;
}

Assistant:

TEST(MLKEMTest, Iterate1024) {
  // The structure of this test is taken from
  // https://github.com/C2SP/CCTV/blob/main/ML-KEM/README.md?ref=words.filippo.io#accumulated-pq-crystals-vectors
  // but the final value has been updated to reflect the change from Kyber to
  // ML-KEM.
  uint8_t result[32];
  IteratedTest<MLKEM1024_public_key, MLKEM1024_PUBLIC_KEY_BYTES,
               MLKEM1024_private_key, BCM_MLKEM1024_PRIVATE_KEY_BYTES,
               wrapper_1024_generate_key_external_seed,
               MLKEM1024_public_from_private, wrapper_1024_marshal_private_key,
               MLKEM1024_CIPHERTEXT_BYTES, wrapper_1024_encap_external_entropy,
               MLKEM1024_decap>(result);

  const uint8_t kExpected[32] = {
      0xe3, 0xbf, 0x82, 0xb0, 0x13, 0x30, 0x7b, 0x2e, 0x9d, 0x47, 0xdd,
      0xe7, 0x91, 0xff, 0x6d, 0xfc, 0x82, 0xe6, 0x94, 0xe6, 0x38, 0x24,
      0x04, 0xab, 0xdb, 0x94, 0x8b, 0x90, 0x8b, 0x75, 0xba, 0xd5};
  EXPECT_EQ(Bytes(result), Bytes(kExpected));
}